

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall CoinsViews::InitCache(CoinsViews *this)

{
  long lVar1;
  unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd8;
  unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> *this_00;
  __uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_ffffffffffffffd8,(char *)in_RDI,in_stack_ffffffffffffffcc,
             (AnnotatedMixin<std::recursive_mutex> *)0x148b354);
  this_00 = (unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> *)
            &stack0xfffffffffffffff0;
  std::make_unique<CCoinsViewCache,CCoinsViewErrorCatcher*>
            ((CCoinsViewErrorCatcher **)
             in_stack_fffffffffffffff0._M_t.
             super__Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_>.
             super__Head_base<0UL,_CCoinsViewCache_*,_false>._M_head_impl);
  std::unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>::operator=(this_00,in_RDI)
  ;
  std::unique_ptr<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_>::~unique_ptr(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CoinsViews::InitCache()
{
    AssertLockHeld(::cs_main);
    m_cacheview = std::make_unique<CCoinsViewCache>(&m_catcherview);
}